

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em.cpp
# Opt level: O3

void __thiscall merlin::em::run(em *this)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  ostream *poVar3;
  EVP_PKEY_CTX *in_RSI;
  int iVar4;
  double dVar5;
  timeval tv;
  timeval local_40;
  
  init(this,in_RSI);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[EM] Begin parameter learning ...",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  iVar4 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var2 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  if (0 < this->m_iterations) {
    dVar5 = 0.0;
    do {
      e_step(this);
      m_step(this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": log-likelihood = ",0x13);
      poVar3 = std::ostream::_M_insert<double>(this->m_loglikelihood);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (ABS(this->m_loglikelihood - dVar5) <= this->m_epsilon) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[EM] Converged to log-likelihood ",0x21);
        poVar3 = std::ostream::_M_insert<double>(this->m_loglikelihood);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," after ",7);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," iterations",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        break;
      }
      iVar4 = iVar4 + 1;
      dVar5 = this->m_loglikelihood;
    } while (iVar4 < this->m_iterations);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[EM] Finished parameter learning",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[EM] Time elapsed is ",0x15);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  poVar3 = std::ostream::_M_insert<double>
                     (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) -
                      ((double)_Var1 + (double)_Var2 / 1000000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void em::run() {

	// Initialize the algorithm
	init();
	std::cout << "[EM] Begin parameter learning ..." << std::endl;
	double timeStart = timeSystem();

	// Iterate the e-step and the m-step over the dataset
	double loglikelihood = 0;
	for (int i = 0; i < m_iterations; ++i) {
		e_step();
		m_step();
		std::cout << " " << i << ": log-likelihood = " << m_loglikelihood << std::endl;

		double delta = std::fabs(m_loglikelihood - loglikelihood);
		if (delta <= m_epsilon) {
			std::cout << "[EM] Converged to log-likelihood "
					<< m_loglikelihood << " after " << i << " iterations" << std::endl;
			break; // converged skip this for now
		}

		loglikelihood = m_loglikelihood;
	}

	std::cout << "[EM] Finished parameter learning" << std::endl;
	std::cout << "[EM] Time elapsed is " << (timeSystem() - timeStart) << " seconds" << std::endl;
}